

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool __thiscall
Catch::Matchers::Floating::WithinUlpsMatcher::match(WithinUlpsMatcher *this,double *matchee)

{
  ReusableStringStream *pRVar1;
  SourceLineInfo local_68;
  ReusableStringStream local_58;
  string local_40;
  double *local_20;
  double *matchee_local;
  WithinUlpsMatcher *this_local;
  
  local_20 = matchee;
  matchee_local = (double *)this;
  if (this->m_type == Float) {
    this_local._7_1_ =
         anon_unknown_1::almostEqualUlps<float>((float)*matchee,(float)this->m_target,this->m_ulps);
  }
  else {
    if (this->m_type != Double) {
      ReusableStringStream::ReusableStringStream(&local_58);
      SourceLineInfo::SourceLineInfo
                (&local_68,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/csguth[P]Liberty/build_O0/_deps/catch2-src/single_include/catch2/catch.hpp"
                 ,0x2d56);
      pRVar1 = ReusableStringStream::operator<<(&local_58,&local_68);
      pRVar1 = ReusableStringStream::operator<<(pRVar1,(char (*) [26])": Internal Catch2 error: ");
      pRVar1 = ReusableStringStream::operator<<
                         (pRVar1,(char (*) [32])"Unknown FloatingPointKind value");
      ReusableStringStream::str_abi_cxx11_(&local_40,pRVar1);
      throw_logic_error(&local_40);
    }
    this_local._7_1_ = anon_unknown_1::almostEqualUlps<double>(*matchee,this->m_target,this->m_ulps)
    ;
  }
  return this_local._7_1_;
}

Assistant:

bool WithinUlpsMatcher::match(double const& matchee) const {
        switch (m_type) {
        case FloatingPointKind::Float:
            return almostEqualUlps<float>(static_cast<float>(matchee), static_cast<float>(m_target), m_ulps);
        case FloatingPointKind::Double:
            return almostEqualUlps<double>(matchee, m_target, m_ulps);
        default:
            CATCH_INTERNAL_ERROR( "Unknown FloatingPointKind value" );
        }
    }